

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

ArrayPtr<unsigned_char> __thiscall kj::VectorOutputStream::getWriteBuffer(VectorOutputStream *this)

{
  byte *pbVar1;
  uchar *puVar2;
  size_t sVar3;
  ArrayPtr<unsigned_char> AVar4;
  
  pbVar1 = this->fillPos;
  puVar2 = (this->vector).ptr;
  sVar3 = (this->vector).size_;
  if (pbVar1 == puVar2 + sVar3) {
    grow(this,sVar3 + 1);
    pbVar1 = this->fillPos;
    puVar2 = (this->vector).ptr;
    sVar3 = (this->vector).size_;
  }
  AVar4.size_ = puVar2 + (sVar3 - (long)pbVar1);
  AVar4.ptr = pbVar1;
  return AVar4;
}

Assistant:

ArrayPtr<byte> VectorOutputStream::getWriteBuffer() {
  // Grow if needed.
  if (fillPos == vector.end()) {
    grow(vector.size() + 1);
  }

  return arrayPtr(fillPos, vector.end());
}